

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void amrex::readBoxArray(BoxArray *ba,istream *is,bool bReadSpecial)

{
  void *pvVar1;
  ulong uVar2;
  byte in_DL;
  Box *in_RSI;
  undefined8 in_RDI;
  Box b;
  int i;
  ULong in_hash;
  int maxbox;
  Long in_stack_ffffffffffffffb8;
  BoxArray *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  ulong local_28;
  int local_20;
  byte local_19;
  BoxArray *in_stack_fffffffffffffff8;
  
  local_19 = in_DL & 1;
  if (local_19 == 0) {
    BoxArray::readFrom((BoxArray *)b.bigend.vect._4_8_,(istream *)b._8_8_);
  }
  else {
    pvVar1 = (void *)std::istream::ignore((long)in_RSI,100000);
    pvVar1 = (void *)std::istream::operator>>(pvVar1,&local_20);
    std::istream::operator>>(pvVar1,&local_28);
    BoxArray::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    for (iVar3 = 0; iVar3 < local_20; iVar3 = iVar3 + 1) {
      Box::Box((Box *)in_stack_ffffffffffffffc0);
      operator>>((istream *)b.smallend.vect._0_8_,(Box *)in_stack_fffffffffffffff8);
      BoxArray::set(in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20),in_RSI);
    }
    std::istream::ignore((long)in_RSI,100000);
    uVar2 = std::ios::fail();
    if ((uVar2 & 1) != 0) {
      Error_host((char *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    }
  }
  return;
}

Assistant:

void
readBoxArray (BoxArray&     ba,
              std::istream& is,
              bool          bReadSpecial)
{
    if (bReadSpecial == false)
    {
        ba.readFrom(is);
    }
    else
    {
        BL_ASSERT(ba.size() == 0);
        int maxbox;
        ULong in_hash; // will be ignored
        is.ignore(bl_ignore_max, '(') >> maxbox >> in_hash;
        ba.resize(maxbox);
        for (int i = 0; i < maxbox; i++)
        {
            Box b;
            is >> b;
            ba.set(i, b);
        }
        is.ignore(bl_ignore_max, ')');

        if (is.fail()) {
            amrex::Error("readBoxArray(BoxArray&,istream&,int) failed");
        }
    }
}